

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::base_internal::SpinLock::SlowUnlock(SpinLock *this,uint32_t lock_value)

{
  AbslInternalSpinLockWake_lts_20250127(&this->lockword_,false);
  if ((lock_value & 0xfffffff8) == 8) {
    return;
  }
  (*(code *)submit_profile_data)(this,(ulong)(lock_value & 0xfffffff8) << 4);
  return;
}

Assistant:

void SpinLock::SlowUnlock(uint32_t lock_value) {
  base_internal::SpinLockWake(&lockword_,
                              false);  // wake waiter if necessary

  // If our acquisition was contended, collect contentionz profile info.  We
  // reserve a unitary wait time to represent that a waiter exists without our
  // own acquisition having been contended.
  if ((lock_value & kWaitTimeMask) != kSpinLockSleeper) {
    const int64_t wait_cycles = DecodeWaitCycles(lock_value);
    ABSL_TSAN_MUTEX_PRE_DIVERT(this, 0);
    submit_profile_data(this, wait_cycles);
    ABSL_TSAN_MUTEX_POST_DIVERT(this, 0);
  }
}